

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faxman.h
# Opt level: O1

void ClownLZSS::Internal::Faxman::Decompress<std::ifstream,std::ofstream&>
               (DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *input,
               DecompressorOutput<std::basic_ofstream<char>_&> *output)

{
  byte bVar1;
  bool bVar2;
  uchar value;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  BitField<decltype(input)> descriptor_bits;
  Reader<1U,_(ClownLZSS::Internal::BitField::ReadWhen)0,_(ClownLZSS::Internal::BitField::PopWhere)0,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_&>
  local_48;
  
  iVar4 = std::ostream::tellp();
  iVar7 = 1;
  uVar9 = 0;
  do {
    uVar5 = std::istream::get();
    uVar9 = (ulong)((uVar5 & 0xff) << 8) | uVar9 >> 8;
    iVar7 = iVar7 + -1;
  } while (iVar7 == 0);
  local_48.bits = 0;
  local_48.bits_remaining = 8;
  local_48.input = input;
  bVar1 = std::istream::get();
  local_48.bits = (unsigned_long)bVar1;
  if (uVar9 != 0) {
    do {
      bVar2 = BitField::
              Reader<1U,_(ClownLZSS::Internal::BitField::ReadWhen)0,_(ClownLZSS::Internal::BitField::PopWhere)0,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_&>
              ::Pop(&local_48);
      iVar7 = (int)uVar9;
      if (bVar2) {
        uVar9 = (ulong)(iVar7 - 1);
        value = std::istream::get();
        DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_2048U,_34U,_-1>::
        WriteImplementation(output,value);
      }
      else {
        bVar2 = BitField::
                Reader<1U,_(ClownLZSS::Internal::BitField::ReadWhen)0,_(ClownLZSS::Internal::BitField::PopWhere)0,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_&>
                ::Pop(&local_48);
        if (bVar2) {
          uVar8 = iVar7 - 2;
          bVar1 = std::istream::get();
          uVar6 = std::istream::get();
          uVar5 = bVar1 + 1 + (uVar6 & 0xe0) * 8;
          uVar6 = (uVar6 & 0x1f) + 3;
        }
        else {
          bVar1 = std::istream::get();
          uVar5 = 0x100 - bVar1;
          bVar2 = BitField::
                  Reader<1U,_(ClownLZSS::Internal::BitField::ReadWhen)0,_(ClownLZSS::Internal::BitField::PopWhere)0,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_&>
                  ::Pop(&local_48);
          uVar8 = iVar7 - 4;
          bVar3 = BitField::
                  Reader<1U,_(ClownLZSS::Internal::BitField::ReadWhen)0,_(ClownLZSS::Internal::BitField::PopWhere)0,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_&>
                  ::Pop(&local_48);
          uVar6 = (uint)bVar3 + (uint)bVar2 * 2 + 2;
        }
        uVar9 = (ulong)uVar8;
        iVar7 = std::ostream::tellp();
        if ((uint)(iVar7 - iVar4) < uVar5) {
          do {
            DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_2048U,_34U,_-1>
            ::WriteImplementation(output,'\0');
            uVar6 = uVar6 - 1;
          } while (uVar6 != 0);
        }
        else {
          DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_2048U,_34U,_-1>::
          Copy(output,uVar5,uVar6);
        }
      }
    } while ((int)uVar9 != 0);
  }
  return;
}

Assistant:

void Decompress(DecompressorInput<T1> &input, DecompressorOutput<T2> &output)
			{
				const auto output_start_position = output.Tell();

				unsigned int descriptor_bits_remaining = input.ReadLE16();

				BitField<decltype(input)> descriptor_bits(input);

				const auto PopDescriptorBit = [&]()
				{
					--descriptor_bits_remaining;
					return descriptor_bits.Pop();
				};

				while (descriptor_bits_remaining != 0)
				{
					if (PopDescriptorBit())
					{
						// Uncompressed.
						output.Write(input.Read());
					}
					else
					{
						// Dictionary match.
						unsigned int distance, count;

						if (PopDescriptorBit())
						{
							const unsigned int first_byte = input.Read();
							const unsigned int second_byte = input.Read();

							distance = (first_byte | ((second_byte << 3) & 0x700)) + 1;
							count = (second_byte & 0x1F) + 3;
						}
						else
						{
							distance = 0x100 - input.Read();
							count = 2;

							if (PopDescriptorBit())
								count += 2;
							if (PopDescriptorBit())
								count += 1;
						}

						const unsigned int output_position = output.Distance(output_start_position);

						if (distance > output_position)
						{
							// Zero-fill.
							output.Fill(0, count);
						}
						else
						{
							// Copy.
							output.Copy(distance, count);
						}
					}
				}
			}